

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O1

void __thiscall
pzgeom::TPZArc3D::X<Fad<double>>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *loc,
          TPZVec<Fad<double>_> *result)

{
  Fad<double> *pFVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  double dVar5;
  double *dxp;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Fad<double> *pFVar13;
  long lVar14;
  double dVar15;
  bool bVar16;
  double dVar17;
  Fad<double> vectRotated;
  Fad<double> centerCoord;
  Fad<double> deflection;
  TPZManVector<Fad<double>,_3> MappedBASE2D;
  Fad<double> local_280;
  TPZArc3D *local_260;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_258;
  undefined1 local_248 [8];
  Fad<double> local_240;
  double local_220;
  Fad<double> local_218;
  _func_int **local_1f8;
  TPZVec<Fad<double>_> *local_1f0;
  TPZFMatrix<double> *local_1e8;
  undefined1 local_1e0 [24];
  double dStack_1c8;
  Fad<double> *local_1c0;
  Fad<double> *local_1b8;
  int64_t local_1b0;
  TPZVec<int> local_1a8;
  int local_188 [6];
  undefined **local_170;
  Fad<double> *local_168;
  int64_t iStack_160;
  int64_t local_158;
  Fad<double> local_150 [5];
  TPZManVector<Fad<double>,_3> local_b0;
  
  local_1e0._0_8_ = (_func_int **)0x0;
  local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffff00000000;
  local_1e0._16_8_ = (double *)0x0;
  dStack_1c8 = 0.0;
  local_260 = this;
  local_1f0 = result;
  local_1e8 = coord;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_b0,3,(Fad<double> *)local_1e0);
  Fad<double>::~Fad((Fad<double> *)local_1e0);
  pFVar13 = local_150;
  local_1e0._8_8_ = 2;
  local_1e0._16_8_ = (double *)0x2;
  dStack_1c8 = (double)((ulong)dStack_1c8 & 0xffffffffffff0000);
  local_1e0._0_8_ = &PTR__TPZFMatrix_018a1c70;
  local_1b0 = 4;
  local_1c0 = pFVar13;
  local_1b8 = pFVar13;
  TPZVec<int>::TPZVec(&local_1a8,0);
  local_1a8.fStore = local_188;
  local_1a8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1a8.fNElements = 0;
  local_1a8.fNAlloc = 0;
  local_170 = &PTR__TPZVec_01846938;
  local_168 = (Fad<double> *)0x0;
  iStack_160 = 0;
  local_158 = 0;
  local_1f8 = (_func_int **)&PTR__TPZFNMatrix_018a1980;
  local_1e0._0_8_ = &PTR__TPZFNMatrix_018a1980;
  lVar14 = 0;
  do {
    Fad<double>::Fad(pFVar13);
    lVar14 = lVar14 + -0x20;
    pFVar13 = pFVar13 + 1;
  } while (lVar14 != -0xa0);
  dVar15 = local_260->fRadius;
  pFVar13 = loc->fStore;
  dVar17 = local_260->fAngle * dVar15;
  local_218.val_ = ((pFVar13->val_ + 1.0) * dVar17) / (dVar15 + dVar15);
  iVar2 = (pFVar13->dx_).num_elts;
  local_218.dx_.num_elts = 0;
  local_218.dx_.ptr_to_data = (double *)0x0;
  if (0 < (long)iVar2) {
    local_220 = dVar17;
    local_218.dx_.num_elts = iVar2;
    local_218.dx_.ptr_to_data = (double *)operator_new__((long)iVar2 << 3);
    dVar17 = local_220;
  }
  local_218.defaultVal = 0.0;
  lVar14 = (long)(pFVar13->dx_).num_elts;
  if (0 < lVar14) {
    lVar8 = 0;
    do {
      local_218.dx_.ptr_to_data[lVar8] =
           ((pFVar13->dx_).ptr_to_data[lVar8] * dVar17) / (dVar15 + dVar15);
      lVar8 = lVar8 + 1;
    } while (lVar14 != lVar8);
  }
  FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)&local_280,&local_218);
  FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_248,(FadFuncCos<Fad<double>_> *)&local_280)
  ;
  Fad<double>::~Fad(&local_280);
  if (((long)local_1e0._8_8_ < 1) || ((long)local_1e0._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=(local_1c0,(FadExpr<FadFuncCos<Fad<double>_>_> *)local_248);
  Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
  FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)&local_280,&local_218);
  FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_248,(FadFuncSin<Fad<double>_> *)&local_280)
  ;
  Fad<double>::~Fad(&local_280);
  if (((long)local_1e0._8_8_ < 1) || ((long)local_1e0._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_1c0 + local_1e0._8_8_,(FadExpr<FadFuncSin<Fad<double>_>_> *)local_248);
  Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
  FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)&local_280,&local_218);
  FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_248,(FadFuncSin<Fad<double>_> *)&local_280)
  ;
  Fad<double>::~Fad(&local_280);
  local_258.fadexpr_.left_ = (Fad<double> *)local_248;
  if ((1 < (long)local_1e0._8_8_) && (0 < (long)local_1e0._16_8_)) {
    Fad<double>::operator=
              (local_1c0 + 1,
               (FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)&local_258);
    Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)&local_280,&local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_248,
               (FadFuncCos<Fad<double>_> *)&local_280);
    Fad<double>::~Fad(&local_280);
    if (((long)local_1e0._8_8_ < 2) || ((long)local_1e0._16_8_ < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (local_1c0 + local_1e0._8_8_ + 1,(FadExpr<FadFuncCos<Fad<double>_>_> *)local_248);
    Fad<double>::~Fad((Fad<double> *)(local_248 + 8));
    Fad<double>::Fad((Fad<double> *)local_248);
    local_280.dx_.num_elts = 0;
    local_280.dx_.ptr_to_data = (double *)0x0;
    local_280.defaultVal = 0.0;
    lVar14 = 0;
    do {
      local_280.val_ = 0.0;
      if (local_280.dx_.num_elts != 0) {
        local_258.fadexpr_.left_ = (Fad<double> *)0x0;
        Vector<double>::operator=(&local_280.dx_,(double *)&local_258);
      }
      lVar8 = 0;
      do {
        if (((long)local_1e0._8_8_ <= lVar14) || ((long)local_1e0._16_8_ <= lVar8)) {
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar15 = (local_260->finitialVector).super_TPZVec<double>.fStore[lVar8];
        uVar3 = local_1c0[local_1e0._8_8_ * lVar8 + lVar14].dx_.num_elts;
        lVar12 = (long)(int)uVar3;
        pFVar13 = local_1c0 + local_1e0._8_8_ * lVar8 + lVar14;
        if (lVar12 != 0) {
          if ((ulong)(uint)local_280.dx_.num_elts == 0) {
            uVar10 = lVar12 * 8;
            if ((int)uVar3 < 0) {
              uVar10 = 0xffffffffffffffff;
            }
            local_280.dx_.num_elts = uVar3;
            local_280.dx_.ptr_to_data = (double *)operator_new__(uVar10);
            if ((pFVar13->dx_).num_elts == 0) {
              if (0 < (int)uVar3) {
                lVar9 = 0;
                do {
                  local_280.dx_.ptr_to_data[lVar9] = pFVar13->defaultVal * dVar15;
                  lVar9 = lVar9 + 1;
                } while (lVar12 != lVar9);
              }
            }
            else if (0 < (int)uVar3) {
              pdVar7 = (pFVar13->dx_).ptr_to_data;
              lVar9 = 0;
              do {
                local_280.dx_.ptr_to_data[lVar9] = pdVar7[lVar9] * dVar15;
                lVar9 = lVar9 + 1;
              } while (lVar12 != lVar9);
            }
          }
          else if (0 < local_280.dx_.num_elts) {
            pdVar7 = (pFVar13->dx_).ptr_to_data;
            uVar10 = 0;
            do {
              local_280.dx_.ptr_to_data[uVar10] =
                   pdVar7[uVar10] * dVar15 + local_280.dx_.ptr_to_data[uVar10];
              uVar10 = uVar10 + 1;
            } while ((uint)local_280.dx_.num_elts != uVar10);
          }
        }
        local_280.val_ = dVar15 * pFVar13->val_ + local_280.val_;
        bVar16 = lVar8 == 0;
        lVar8 = lVar8 + 1;
      } while (bVar16);
      local_248 = (undefined1  [8])
                  ((double)(1 - (int)lVar14) * local_260->fXcenter +
                  (double)(int)lVar14 * local_260->fYcenter);
      if (local_240.val_._0_4_ != 0) {
        local_258.fadexpr_.left_ = (Fad<double> *)0x0;
        Vector<double>::operator=((Vector<double> *)(local_248 + 8),(double *)&local_258);
      }
      local_258.fadexpr_.left_ = (Fad<double> *)local_248;
      local_258.fadexpr_.right_ = &local_280;
      Fad<double>::operator=(local_b0.super_TPZVec<Fad<double>_>.fStore + lVar14,&local_258);
      bVar16 = lVar14 == 0;
      lVar14 = lVar14 + 1;
    } while (bVar16);
    local_b0.super_TPZVec<Fad<double>_>.fStore[2].val_ = 0.0;
    if (local_b0.super_TPZVec<Fad<double>_>.fStore[2].dx_.num_elts != 0) {
      local_258.fadexpr_.left_ = (Fad<double> *)0x0;
      Vector<double>::operator=
                (&local_b0.super_TPZVec<Fad<double>_>.fStore[2].dx_,(double *)&local_258);
    }
    dVar15 = 0.0;
    while( true ) {
      local_280.val_ = 0.0;
      if (local_280.dx_.num_elts != 0) {
        local_258.fadexpr_.left_ = (Fad<double> *)0x0;
        Vector<double>::operator=(&local_280.dx_,(double *)&local_258);
      }
      pFVar13 = local_b0.super_TPZVec<Fad<double>_>.fStore;
      lVar14 = (local_260->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.
               super_TPZBaseMatrix.fRow;
      pdVar7 = (local_260->fIBaseCn).super_TPZFMatrix<double>.fElem;
      uVar10 = (ulong)(uint)local_280.dx_.num_elts;
      lVar8 = 0;
      pdVar6 = local_280.dx_.ptr_to_data;
      local_220 = dVar15;
      do {
        dVar17 = pdVar7[(long)dVar15 + lVar14 * lVar8];
        pFVar1 = pFVar13 + lVar8;
        uVar3 = pFVar13[lVar8].dx_.num_elts;
        lVar12 = (long)(int)uVar3;
        if (lVar12 != 0) {
          if ((int)uVar10 == 0) {
            uVar10 = lVar12 * 8;
            if ((int)uVar3 < 0) {
              uVar10 = 0xffffffffffffffff;
            }
            local_280.dx_.num_elts = uVar3;
            pdVar6 = (double *)operator_new__(uVar10);
            if ((pFVar1->dx_).num_elts == 0) {
              if (0 < (int)uVar3) {
                lVar9 = 0;
                do {
                  pdVar6[lVar9] = pFVar1->defaultVal * dVar17;
                  lVar9 = lVar9 + 1;
                } while (lVar12 != lVar9);
              }
            }
            else if (0 < (int)uVar3) {
              pdVar4 = (pFVar1->dx_).ptr_to_data;
              lVar9 = 0;
              do {
                pdVar6[lVar9] = pdVar4[lVar9] * dVar17;
                lVar9 = lVar9 + 1;
              } while (lVar12 != lVar9);
            }
            uVar10 = (ulong)uVar3;
            local_280.dx_.ptr_to_data = pdVar6;
          }
          else if (0 < (int)uVar10) {
            pdVar4 = (pFVar1->dx_).ptr_to_data;
            uVar11 = 0;
            do {
              pdVar6[uVar11] = pdVar4[uVar11] * dVar17 + pdVar6[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
        }
        dVar5 = local_220;
        iVar2 = local_280.dx_.num_elts;
        local_280.val_ = dVar17 * pFVar1->val_ + local_280.val_;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      if (((local_1e8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)local_220) ||
         ((local_1e8->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) break;
      dVar15 = local_1e8->fElem
               [(local_1e8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + (long)local_220]
      ;
      pFVar13 = local_1f0->fStore + (long)local_220;
      uVar10 = (ulong)(uint)local_280.dx_.num_elts;
      uVar3 = local_1f0->fStore[(long)local_220].dx_.num_elts;
      if (local_280.dx_.num_elts != uVar3) {
        if (local_280.dx_.num_elts == 0) {
          if (uVar3 != 0) {
            pdVar7 = (pFVar13->dx_).ptr_to_data;
            if (pdVar7 != (double *)0x0) {
              operator_delete__(pdVar7);
            }
            (pFVar13->dx_).num_elts = 0;
            (pFVar13->dx_).ptr_to_data = (double *)0x0;
          }
        }
        else {
          if (uVar3 != 0) {
            pdVar7 = (pFVar13->dx_).ptr_to_data;
            if (pdVar7 != (double *)0x0) {
              operator_delete__(pdVar7);
            }
            (pFVar13->dx_).num_elts = 0;
            (pFVar13->dx_).ptr_to_data = (double *)0x0;
          }
          (pFVar13->dx_).num_elts = iVar2;
          uVar11 = (long)iVar2 << 3;
          if (iVar2 < 0) {
            uVar11 = 0xffffffffffffffff;
          }
          pdVar7 = (double *)operator_new__(uVar11);
          (pFVar13->dx_).ptr_to_data = pdVar7;
        }
      }
      if (iVar2 != 0) {
        pdVar7 = (pFVar13->dx_).ptr_to_data;
        if (local_280.dx_.num_elts == 0) {
          if (0 < iVar2) {
            uVar11 = 0;
            do {
              pdVar7[uVar11] = local_280.defaultVal;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
        }
        else if (0 < iVar2) {
          uVar11 = 0;
          do {
            pdVar7[uVar11] = local_280.dx_.ptr_to_data[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
      }
      pFVar13->val_ = dVar15 + local_280.val_;
      dVar15 = (double)((long)dVar5 + 1);
      if (dVar15 == 1.48219693752374e-323) {
        Fad<double>::~Fad(&local_280);
        Fad<double>::~Fad((Fad<double> *)local_248);
        Fad<double>::~Fad(&local_218);
        local_1e0._0_8_ = local_1f8;
        lVar14 = 0x110;
        do {
          Fad<double>::~Fad((Fad<double> *)(local_1e0 + lVar14));
          lVar14 = lVar14 + -0x20;
        } while (lVar14 != 0x70);
        TPZFMatrix<Fad<double>_>::~TPZFMatrix
                  ((TPZFMatrix<Fad<double>_> *)local_1e0,&PTR_PTR_018a1c38);
        TPZManVector<Fad<double>,_3>::~TPZManVector(&local_b0);
        return;
      }
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            /** Computing initialVector = (iniR2 - CenterR2) */
            TPZManVector<T,3> MappedBASE2D(3,0.);
            
            TPZFNMatrix<4,T> RotMatrix(2,2);
            T deflection = fAngle * fRadius * (loc[0] + 1.) / (2.*fRadius);
            RotMatrix(0,0) =  cos(deflection); RotMatrix(0,1) = sin(deflection);
            RotMatrix(1,0) = -sin(deflection); RotMatrix(1,1) = cos(deflection);
            
            /** MappedPoint_R2 = centerCoord + vectorRotated , where Vx = RotationMatrix . Va */
            T centerCoord, vectRotated = 0.;
            for(int i = 0; i < 2; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 2; j++) vectRotated += RotMatrix(i,j)*finitialVector[j];
                centerCoord = (1-i)*fXcenter + i*fYcenter;
                MappedBASE2D[i] = centerCoord + vectRotated;
            }
            
            /** Changing Basis of Obtained MappedPoint from R2 to R3 */
            MappedBASE2D[2] = 0.;
            for(int i = 0; i < 3; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 3; j++)
                {
                    vectRotated += fIBaseCn.GetVal(i,j)*MappedBASE2D[j];
                }
                result[i] = vectRotated + coord(i,2);
            }

        }